

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

uint write_until_data_queued(void)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  undefined8 uVar3;
  void *pvVar4;
  undefined8 *extraout_RDX;
  uv_pipe_t *puVar5;
  ulong uVar6;
  undefined1 auStack_80 [16];
  uv_pipe_t *puStack_70;
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  uv_pipe_t *puStack_48;
  undefined1 auStack_38 [8];
  code *pcStack_30;
  
  uVar6 = 0;
  puVar5 = (uv_pipe_t *)write_reqs;
  do {
    pcStack_30 = (code *)0x162fce;
    iVar1 = uv_write(puVar5,&channel,&large_buf,1,closed_handle_large_write_cb);
    if (iVar1 != 0) {
      pcStack_30 = send_handle_and_close;
      write_until_data_queued_cold_1();
      puStack_48 = (uv_pipe_t *)0x163009;
      uVar3 = uv_default_loop();
      puStack_48 = (uv_pipe_t *)0x163018;
      iVar1 = uv_tcp_init(uVar3,&tcp_server);
      if (iVar1 == 0) {
        puStack_48 = (uv_pipe_t *)0x163032;
        iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_38);
        if (iVar1 != 0) goto LAB_00163096;
        puStack_48 = (uv_pipe_t *)0x163049;
        iVar1 = uv_tcp_bind(&tcp_server,auStack_38,0);
        if (iVar1 != 0) goto LAB_0016309b;
        puStack_48 = (uv_pipe_t *)0x16307a;
        iVar1 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
        if (iVar1 == 0) {
          puStack_48 = (uv_pipe_t *)0x16308c;
          uVar2 = uv_close(&tcp_server,0);
          return uVar2;
        }
      }
      else {
        puStack_48 = (uv_pipe_t *)0x163096;
        send_handle_and_close_cold_1();
LAB_00163096:
        puStack_48 = (uv_pipe_t *)0x16309b;
        send_handle_and_close_cold_2();
LAB_0016309b:
        puStack_48 = (uv_pipe_t *)0x1630a0;
        send_handle_and_close_cold_3();
      }
      puStack_48 = (uv_pipe_t *)ipc_helper_bind_twice;
      send_handle_and_close_cold_4();
      puStack_70 = (uv_pipe_t *)0x1630c0;
      puStack_48 = puVar5;
      iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_58);
      if (iVar1 == 0) {
        puStack_70 = (uv_pipe_t *)0x1630cd;
        uVar3 = uv_default_loop();
        puStack_70 = (uv_pipe_t *)0x1630e1;
        iVar1 = uv_pipe_init(uVar3,&channel,1);
        if (iVar1 != 0) goto LAB_0016326a;
        puVar5 = &channel;
        puStack_70 = (uv_pipe_t *)0x1630fa;
        uv_pipe_open(&channel,0);
        puStack_70 = (uv_pipe_t *)0x163102;
        iVar1 = uv_is_readable(&channel);
        if (iVar1 != 1) goto LAB_0016326f;
        puStack_70 = (uv_pipe_t *)0x163117;
        iVar1 = uv_is_writable(&channel);
        if (iVar1 != 1) goto LAB_00163274;
        puStack_70 = (uv_pipe_t *)0x16312c;
        iVar1 = uv_is_closing(&channel);
        if (iVar1 != 0) goto LAB_00163279;
        puStack_70 = (uv_pipe_t *)0x163145;
        auStack_68 = uv_buf_init("hello\n",6);
        puStack_70 = (uv_pipe_t *)0x163153;
        uVar3 = uv_default_loop();
        puStack_70 = (uv_pipe_t *)0x163162;
        iVar1 = uv_tcp_init(uVar3,&tcp_server);
        if (iVar1 != 0) goto LAB_0016327e;
        puStack_70 = (uv_pipe_t *)0x16316f;
        uVar3 = uv_default_loop();
        puStack_70 = (uv_pipe_t *)0x16317e;
        iVar1 = uv_tcp_init(uVar3,&tcp_server2);
        if (iVar1 != 0) goto LAB_00163283;
        puStack_70 = (uv_pipe_t *)0x163199;
        iVar1 = uv_tcp_bind(&tcp_server,auStack_58,0);
        if (iVar1 != 0) goto LAB_00163288;
        puStack_70 = (uv_pipe_t *)0x1631b4;
        iVar1 = uv_tcp_bind(&tcp_server2,auStack_58,0);
        if (iVar1 != 0) goto LAB_0016328d;
        puStack_70 = (uv_pipe_t *)0x1631e1;
        iVar1 = uv_write2(&write_req,&channel,auStack_68,1,&tcp_server,0);
        if (iVar1 != 0) goto LAB_00163292;
        puStack_70 = (uv_pipe_t *)0x16320e;
        iVar1 = uv_write2(&write_req2,&channel,auStack_68,1,&tcp_server2,0);
        if (iVar1 != 0) goto LAB_00163297;
        puStack_70 = (uv_pipe_t *)0x16321b;
        uVar3 = uv_default_loop();
        puStack_70 = (uv_pipe_t *)0x163225;
        iVar1 = uv_run(uVar3,0);
        if (iVar1 != 0) goto LAB_0016329c;
        puStack_70 = (uv_pipe_t *)0x16322e;
        puVar5 = (uv_pipe_t *)uv_default_loop();
        puStack_70 = (uv_pipe_t *)0x163242;
        uv_walk(puVar5,close_walk_cb,0);
        puStack_70 = (uv_pipe_t *)0x16324c;
        uv_run(puVar5,0);
        puStack_70 = (uv_pipe_t *)0x163251;
        uVar3 = uv_default_loop();
        puStack_70 = (uv_pipe_t *)0x163259;
        iVar1 = uv_loop_close(uVar3);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        puStack_70 = (uv_pipe_t *)0x16326a;
        ipc_helper_bind_twice_cold_1();
LAB_0016326a:
        puStack_70 = (uv_pipe_t *)0x16326f;
        ipc_helper_bind_twice_cold_2();
LAB_0016326f:
        puStack_70 = (uv_pipe_t *)0x163274;
        ipc_helper_bind_twice_cold_3();
LAB_00163274:
        puStack_70 = (uv_pipe_t *)0x163279;
        ipc_helper_bind_twice_cold_4();
LAB_00163279:
        puStack_70 = (uv_pipe_t *)0x16327e;
        ipc_helper_bind_twice_cold_5();
LAB_0016327e:
        puStack_70 = (uv_pipe_t *)0x163283;
        ipc_helper_bind_twice_cold_6();
LAB_00163283:
        puStack_70 = (uv_pipe_t *)0x163288;
        ipc_helper_bind_twice_cold_7();
LAB_00163288:
        puStack_70 = (uv_pipe_t *)0x16328d;
        ipc_helper_bind_twice_cold_8();
LAB_0016328d:
        puStack_70 = (uv_pipe_t *)0x163292;
        ipc_helper_bind_twice_cold_9();
LAB_00163292:
        puStack_70 = (uv_pipe_t *)0x163297;
        ipc_helper_bind_twice_cold_10();
LAB_00163297:
        puStack_70 = (uv_pipe_t *)0x16329c;
        ipc_helper_bind_twice_cold_11();
LAB_0016329c:
        puStack_70 = (uv_pipe_t *)0x1632a1;
        ipc_helper_bind_twice_cold_12();
      }
      puStack_70 = (uv_pipe_t *)ipc_helper_send_zero;
      ipc_helper_bind_twice_cold_13();
      puStack_70 = puVar5;
      auStack_80 = uv_buf_init(0,0);
      uVar3 = uv_default_loop();
      puVar5 = &channel;
      iVar1 = uv_pipe_init(uVar3,&channel,0);
      if (iVar1 == 0) {
        puVar5 = (uv_pipe_t *)0x0;
        uv_pipe_open(&channel);
        iVar1 = uv_is_readable(&channel);
        if (iVar1 != 1) goto LAB_001633a9;
        iVar1 = uv_is_writable(&channel);
        if (iVar1 != 1) goto LAB_001633ae;
        iVar1 = uv_is_closing(&channel);
        if (iVar1 != 0) goto LAB_001633b3;
        puVar5 = &channel;
        iVar1 = uv_write(&write_req,&channel,auStack_80,1,send_zero_write_cb);
        if (iVar1 != 0) goto LAB_001633b8;
        uVar3 = uv_default_loop();
        puVar5 = (uv_pipe_t *)0x0;
        iVar1 = uv_run(uVar3);
        if (iVar1 != 0) goto LAB_001633bd;
        if (send_zero_write == 1) {
          uVar3 = uv_default_loop();
          uv_walk(uVar3,close_walk_cb,0);
          puVar5 = (uv_pipe_t *)0x0;
          uv_run(uVar3);
          uVar3 = uv_default_loop();
          iVar1 = uv_loop_close(uVar3);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_001633c7;
        }
      }
      else {
        ipc_helper_send_zero_cold_1();
LAB_001633a9:
        ipc_helper_send_zero_cold_2();
LAB_001633ae:
        ipc_helper_send_zero_cold_3();
LAB_001633b3:
        ipc_helper_send_zero_cold_4();
LAB_001633b8:
        ipc_helper_send_zero_cold_5();
LAB_001633bd:
        ipc_helper_send_zero_cold_6();
      }
      ipc_helper_send_zero_cold_7();
LAB_001633c7:
      ipc_helper_send_zero_cold_8();
      if ((int)puVar5 == 0) {
        send_zero_write = send_zero_write + 1;
        return extraout_EAX;
      }
      send_zero_write_cb_cold_1();
      pvVar4 = malloc((size_t)puVar5);
      *extraout_RDX = pvVar4;
      extraout_RDX[1] = puVar5;
      return (uint)pvVar4;
    }
    if (0x12a < uVar6) break;
    uVar6 = uVar6 + 1;
    puVar5 = (uv_pipe_t *)puVar5->write_queue;
  } while (channel.write_queue_size == 0);
  return (uint)channel.write_queue_size;
}

Assistant:

static unsigned int write_until_data_queued() {
  unsigned int i;
  int r;

  i = 0;
  do {
    r = uv_write(&write_reqs[i],
                 (uv_stream_t*)&channel,
                 &large_buf,
                 1,
                 closed_handle_large_write_cb);
    ASSERT(r == 0);
    i++;
  } while (channel.write_queue_size == 0 &&
           i < ARRAY_SIZE(write_reqs));

  return channel.write_queue_size;
}